

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O0

int pfx_table_add(pfx_table *pfx_table,pfx_record *record)

{
  int iVar1;
  trie_node *ptVar2;
  data_elem *pdVar3;
  long in_FS_OFFSET;
  int rtval;
  trie_node *node;
  trie_node *root;
  pfx_record *record_local;
  pfx_table *pfx_table_local;
  trie_node *local_28;
  trie_node *new_node;
  trie_node *new_node_1;
  _Bool found;
  long lStack_10;
  uint lvl;
  
  lStack_10 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&pfx_table->lock);
  ptVar2 = pfx_table_get_root(pfx_table,(record->prefix).ver);
  new_node_1._4_4_ = 0;
  if (ptVar2 == (trie_node *)0x0) {
    local_28 = (trie_node *)0x0;
    iVar1 = pfx_table_create_node(&local_28,record);
    if (iVar1 == -1) {
      pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
      pfx_table_local._4_4_ = -1;
    }
    else {
      if ((record->prefix).ver == LRTR_IPV4) {
        pfx_table->ipv4 = local_28;
      }
      else {
        pfx_table->ipv6 = local_28;
      }
      pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
      pfx_table_notify_clients(pfx_table,record,true);
      pfx_table_local._4_4_ = 0;
    }
  }
  else {
    ptVar2 = trie_lookup_exact(ptVar2,&record->prefix,record->min_len,
                               (uint *)((long)&new_node_1 + 4),(_Bool *)((long)&new_node_1 + 3));
    if ((new_node_1._3_1_ & 1) == 0) {
      new_node = (trie_node *)0x0;
      iVar1 = pfx_table_create_node(&new_node,record);
      if (iVar1 == -1) {
        pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
        pfx_table_local._4_4_ = -1;
      }
      else {
        trie_insert(ptVar2,new_node,new_node_1._4_4_);
        pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
        pfx_table_notify_clients(pfx_table,record,true);
        pfx_table_local._4_4_ = 0;
      }
    }
    else {
      pdVar3 = pfx_table_find_elem((node_data *)ptVar2->data,record,(uint *)0x0);
      if (pdVar3 == (data_elem *)0x0) {
        pfx_table_local._4_4_ = pfx_table_append_elem((node_data *)ptVar2->data,record);
        pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
        if (pfx_table_local._4_4_ == 0) {
          pfx_table_notify_clients(pfx_table,record,true);
        }
      }
      else {
        pthread_rwlock_unlock((pthread_rwlock_t *)&pfx_table->lock);
        pfx_table_local._4_4_ = -2;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lStack_10) {
    __stack_chk_fail();
  }
  return pfx_table_local._4_4_;
}

Assistant:

RTRLIB_EXPORT int pfx_table_add(struct pfx_table *pfx_table, const struct pfx_record *record)
{
	pthread_rwlock_wrlock(&(pfx_table->lock));

	struct trie_node *root = pfx_table_get_root(pfx_table, record->prefix.ver);
	unsigned int lvl = 0;

	if (root) {
		bool found;
		struct trie_node *node = trie_lookup_exact(root, &(record->prefix), record->min_len, &lvl, &found);

		if (found) { // node with prefix exists
			if (pfx_table_find_elem(node->data, record, NULL)) {
				pthread_rwlock_unlock(&pfx_table->lock);
				return PFX_DUPLICATE_RECORD;
			}
			// append record to note_data array
			int rtval = pfx_table_append_elem(node->data, record);

			pthread_rwlock_unlock(&pfx_table->lock);
			if (rtval == PFX_SUCCESS)
				pfx_table_notify_clients(pfx_table, record, true);
			return rtval;
		}

		// no node with same prefix and prefix_len found
		struct trie_node *new_node = NULL;

		if (pfx_table_create_node(&new_node, record) == PFX_ERROR) {
			pthread_rwlock_unlock(&pfx_table->lock);
			return PFX_ERROR;
		}
		trie_insert(node, new_node, lvl);
		pthread_rwlock_unlock(&pfx_table->lock);
		pfx_table_notify_clients(pfx_table, record, true);
		return PFX_SUCCESS;
	}

	// tree is empty, record will be the root_node
	struct trie_node *new_node = NULL;

	if (pfx_table_create_node(&new_node, record) == PFX_ERROR) {
		pthread_rwlock_unlock(&pfx_table->lock);
		return PFX_ERROR;
	}
	if (record->prefix.ver == LRTR_IPV4)
		pfx_table->ipv4 = new_node;
	else
		pfx_table->ipv6 = new_node;

	pthread_rwlock_unlock(&pfx_table->lock);
	pfx_table_notify_clients(pfx_table, record, true);
	return PFX_SUCCESS;
}